

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_clrsb_i32_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg)

{
  TCGTemp *ts;
  TCGOp *pTVar1;
  uintptr_t o;
  TCGv_i32 ret_00;
  
  ts = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)ts - (long)tcg_ctx);
  tcg_gen_sari_i32_sparc64(tcg_ctx,ret_00,arg,0x1f);
  pTVar1 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_xor_i32);
  pTVar1->args[0] = (TCGArg)ts;
  pTVar1->args[1] = (TCGArg)ts;
  pTVar1->args[2] = (TCGArg)(arg + (long)tcg_ctx);
  tcg_gen_clzi_i32_sparc64(tcg_ctx,ret_00,ret_00,0x20);
  tcg_gen_subi_i32_sparc64(tcg_ctx,ret,ret_00,1);
  tcg_temp_free_internal_sparc64(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_clrsb_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg)
{
    if (TCG_TARGET_HAS_clz_i32) {
        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_sari_i32(tcg_ctx, t, arg, 31);
        tcg_gen_xor_i32(tcg_ctx, t, t, arg);
        tcg_gen_clzi_i32(tcg_ctx, t, t, 32);
        tcg_gen_subi_i32(tcg_ctx, ret, t, 1);
        tcg_temp_free_i32(tcg_ctx, t);
    } else {
        gen_helper_clrsb_i32(tcg_ctx, ret, arg);
    }
}